

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_easy_api.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  int in_EDI;
  string stub;
  bool binary;
  string sopts;
  string solver;
  string *in_stack_00000400;
  undefined1 in_stack_0000040f;
  string *in_stack_00000410;
  string *in_stack_00000418;
  bool local_131;
  allocator<char> *in_stack_fffffffffffffee0;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *local_108;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [38];
  bool local_6a;
  allocator<char> local_69;
  string local_68 [55];
  undefined1 local_31 [33];
  long local_10;
  int local_8;
  uint local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    printf("%s\n",
           "AMPL NL writer example.\nUsage:\n  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\nwhere <solver> is ipopt, gurobi, minos, ...;\nbinary/text is the NL format (default: binary.)\nExamples:\n  <this_exe> ipopt \"\" text /tmp/stub\n  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\""
          );
    exit(0);
  }
  if (in_EDI < 2) {
    local_108 = "minos";
  }
  else {
    local_108 = *(char **)(in_RSI + 8);
  }
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,local_108,in_stack_fffffffffffffee0);
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  if (local_8 < 3) {
    __a = (allocator<char> *)0x12fa09;
  }
  else {
    __a = *(allocator<char> **)(local_10 + 0x10);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,local_108,__a);
  std::allocator<char>::~allocator(&local_69);
  local_131 = true;
  if (3 < local_8) {
    iVar2 = strcmp("text",*(char **)(local_10 + 0x18));
    local_131 = iVar2 != 0;
  }
  local_6a = local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,local_108,__a);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::string(local_b8,(string *)(local_31 + 1));
  std::__cxx11::string::string(local_d8,local_68);
  std::__cxx11::string::string(local_f8,local_90);
  bVar1 = SolveAndCheck(in_stack_00000418,in_stack_00000410,(bool)in_stack_0000040f,
                        in_stack_00000400);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b8);
  local_4 = (uint)(((bVar1 ^ 0xffU) & 1) != 0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  return local_4;
}

Assistant:

int main(int argc, const char* const* argv) {
  if (argc<2) {
    printf("%s\n",
           "AMPL NL writer example.\n"
           "Usage:\n"
           "  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\n"
           "where <solver> is ipopt, gurobi, minos, ...;\n"
           "binary/text is the NL format (default: binary.)\n"
           "Examples:\n"
           "  <this_exe> ipopt \"\" text /tmp/stub\n"
           "  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\"");
    exit(0);
  }
  std::string solver = (argc>1) ? argv[1] : "minos";
  std::string sopts = (argc>2) ? argv[2] : "";
  bool binary = (argc<=3) || std::strcmp("text", argv[3]);
  std::string stub = (argc>4) ? argv[4] : "";

  if (!SolveAndCheck(solver, sopts, binary, stub))
    return EXIT_FAILURE;
  return EXIT_SUCCESS;
}